

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityTestOutput.cpp
# Opt level: O2

void __thiscall TeamCityTestOutput::printFailure(TeamCityTestOutput *this,TestFailure *failure)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleString SStack_28;
  
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])
            (this,"##teamcity[testFailed name=\'");
  (*failure->_vptr_TestFailure[4])(&SStack_28,failure);
  pcVar3 = SimpleString::asCharString(&SStack_28);
  printEscaped(this,pcVar3);
  SimpleString::~SimpleString(&SStack_28);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"\' message=\'");
  bVar1 = TestFailure::isOutsideTestFile(failure);
  if (!bVar1) {
    bVar1 = TestFailure::isInHelperFunction(failure);
    if (!bVar1) goto LAB_001300b4;
  }
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"TEST failed (");
  (*failure->_vptr_TestFailure[7])(&SStack_28,failure);
  pcVar3 = SimpleString::asCharString(&SStack_28);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,pcVar3);
  SimpleString::~SimpleString(&SStack_28);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,":");
  iVar2 = (*failure->_vptr_TestFailure[8])(failure);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xd])
            (this,CONCAT44(extraout_var,iVar2));
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"): ");
LAB_001300b4:
  (*failure->_vptr_TestFailure[2])(&SStack_28,failure);
  pcVar3 = SimpleString::asCharString(&SStack_28);
  printEscaped(this,pcVar3);
  SimpleString::~SimpleString(&SStack_28);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,":");
  iVar2 = (*failure->_vptr_TestFailure[5])(failure);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xd])
            (this,CONCAT44(extraout_var_00,iVar2));
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"\' details=\'");
  (*failure->_vptr_TestFailure[6])(&SStack_28,failure);
  pcVar3 = SimpleString::asCharString(&SStack_28);
  printEscaped(this,pcVar3);
  SimpleString::~SimpleString(&SStack_28);
  (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[0xb])(this,"\']\n");
  return;
}

Assistant:

void TeamCityTestOutput::printFailure(const TestFailure& failure)
{
    print("##teamcity[testFailed name='");
    printEscaped(failure.getTestNameOnly().asCharString());
    print("' message='");
    if (failure.isOutsideTestFile() || failure.isInHelperFunction()) {
        print("TEST failed (");
        print(failure.getTestFileName().asCharString());
        print(":");
        print(failure.getTestLineNumber());
        print("): ");
    }

    printEscaped(failure.getFileName().asCharString());
    print(":");
    print(failure.getFailureLineNumber());

    print("' details='");
    printEscaped(failure.getMessage().asCharString());
    print("']\n");
}